

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_show_help(char *name)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char logs [256];
  char local_128 [256];
  
  _mpp_log_l(4,"mpi_dec_utils","usage: %s [options]\n",0,name);
  uVar3 = 1;
  lVar6 = 0x10;
  uVar4 = 1;
  uVar5 = 1;
  do {
    uVar1 = uVar3;
    if (*(char **)(&data_start + lVar6) != (char *)0x0) {
      sVar2 = strlen(*(char **)(&data_start + lVar6));
      uVar1 = (uint)sVar2;
      if ((uint)sVar2 < uVar3) {
        uVar1 = uVar3;
      }
    }
    uVar3 = uVar1;
    uVar1 = uVar4;
    if (*(char **)((long)&__dso_handle + lVar6) != (char *)0x0) {
      sVar2 = strlen(*(char **)((long)&__dso_handle + lVar6));
      uVar1 = (uint)sVar2;
      if ((uint)sVar2 < uVar4) {
        uVar1 = uVar4;
      }
    }
    uVar4 = uVar1;
    __s = *(char **)((long)&dec_opts[0].name + lVar6);
    uVar1 = uVar5;
    if (__s != (char *)0x0) {
      sVar2 = strlen(__s);
      uVar1 = (uint)sVar2;
      if ((uint)sVar2 < uVar5) {
        uVar1 = uVar5;
      }
    }
    uVar5 = uVar1;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 400);
  snprintf(local_128,0xff,"-%%-%ds %%-%ds %%-%ds\n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  lVar6 = 0x10;
  do {
    _mpp_log_l(4,"mpi_dec_utils",local_128,0,*(undefined8 *)(&data_start + lVar6),
               *(undefined8 *)((long)&__dso_handle + lVar6),
               *(undefined8 *)((long)&dec_opts[0].name + lVar6));
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 400);
  mpp_show_support_format();
  return -1;
}

Assistant:

RK_S32 mpi_dec_show_help(const char *name)
{
    RK_U32 max_name = 1;
    RK_U32 max_full_name = 1;
    RK_U32 max_help = 1;
    char logs[256];
    RK_U32 len;
    RK_U32 i;

    mpp_log("usage: %s [options]\n", name);

    for (i = 0; i < dec_opt_cnt; i++) {
        MppOptInfo *opt = &dec_opts[i];

        if (opt->name) {
            len = strlen(opt->name);
            if (len > max_name)
                max_name = len;
        }

        if (opt->full_name) {
            len = strlen(opt->full_name);
            if (len > max_full_name)
                max_full_name = len;
        }

        if (opt->help) {
            len = strlen(opt->help);
            if (len > max_help)
                max_help = len;
        }
    }

    snprintf(logs, sizeof(logs) - 1, "-%%-%ds %%-%ds %%-%ds\n", max_name, max_full_name, max_help);

    for (i = 0; i < dec_opt_cnt; i++) {
        MppOptInfo *opt = &dec_opts[i];

        mpp_log(logs, opt->name, opt->full_name, opt->help);
    }
    mpp_show_support_format();

    return -1;
}